

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsum.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  string *this;
  char *__s;
  int vector_length;
  int output_interval;
  int num_data;
  vector<double,_std::allocator<double>_> sum;
  ostringstream error_message_5;
  StatisticsAccumulation accumulation;
  vector<double,_std::allocator<double>_> data;
  ifstream ifs;
  Buffer buffer;
  int local_4b0;
  int local_4ac;
  string local_4a8;
  int local_484;
  ulong local_480;
  vector<double,_std::allocator<double>_> local_478;
  string local_460 [3];
  ios_base local_3f0 [264];
  StatisticsAccumulation local_2e8;
  vector<double,_std::allocator<double>_> local_2d0;
  string local_2b8;
  byte abStack_298 [80];
  ios_base local_248 [408];
  Buffer local_b0;
  
  local_4b0 = 1;
  local_4ac = -1;
  local_480 = 0;
  do {
    while( true ) {
      iVar4 = ya_getopt_long(argc,argv,"l:m:t:ch",(option *)0x0,(int *)0x0);
      if (iVar4 < 0x6c) break;
      if (iVar4 == 0x74) {
        std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)local_460);
        bVar1 = sptk::ConvertStringToInteger(&local_2b8,&local_4ac);
        bVar2 = local_4ac < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,
                     "The argument for the -t option must be a positive integer",0x39);
          local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"vsum","");
          sptk::PrintErrorMessage(local_460,(ostringstream *)&local_2b8);
          goto LAB_00103d3e;
        }
      }
      else if (iVar4 == 0x6d) {
        std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)local_460);
        bVar2 = sptk::ConvertStringToInteger(&local_2b8,&local_4b0);
        bVar1 = local_4b0 < 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        if (!bVar2 || bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,"The argument for the -m option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,"non-negative integer",0x14);
          local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"vsum","");
          sptk::PrintErrorMessage(local_460,(ostringstream *)&local_2b8);
          goto LAB_00103d3e;
        }
        local_4b0 = local_4b0 + 1;
      }
      else {
        if (iVar4 != 0x6c) goto LAB_00103946;
        std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)local_460);
        bVar1 = sptk::ConvertStringToInteger(&local_2b8,&local_4b0);
        bVar2 = local_4b0 < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,
                     "The argument for the -l option must be a positive integer",0x39);
          local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"vsum","");
          sptk::PrintErrorMessage(local_460,(ostringstream *)&local_2b8);
LAB_00103d3e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460[0]._M_dataplus._M_p != &local_460[0].field_2) {
            operator_delete(local_460[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
          std::ios_base::~ios_base(local_248);
          return 1;
        }
      }
    }
    if (iVar4 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2b8,"Too many input files",0x14);
        local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"vsum","");
        sptk::PrintErrorMessage(local_460,(ostringstream *)&local_2b8);
        goto LAB_00103d3e;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = &local_2b8;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Cannot set translation mode",0x1b);
        local_460[0]._M_dataplus._M_p = (pointer)&local_460[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"vsum","");
        sptk::PrintErrorMessage(local_460,(ostringstream *)&local_2b8);
        goto LAB_00103d3e;
      }
      std::ifstream::ifstream(this);
      if ((__s != (char *)0x0) &&
         (std::ifstream::open((char *)&local_2b8,(_Ios_Openmode)__s),
         (abStack_298[*(long *)(local_2b8._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_460,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,__s,sVar5);
        local_b0._vptr_Buffer = (_func_int **)&local_b0.first_order_statistics_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"vsum","");
        sptk::PrintErrorMessage((string *)&local_b0,(ostringstream *)local_460);
        if ((vector<double,_std::allocator<double>_> *)local_b0._vptr_Buffer !=
            &local_b0.first_order_statistics_) {
          operator_delete(local_b0._vptr_Buffer);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
        std::ios_base::~ios_base(local_3f0);
        iVar4 = 1;
        goto LAB_0010405d;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this = (string *)&std::cin;
      }
      sptk::StatisticsAccumulation::StatisticsAccumulation(&local_2e8,local_4b0 + -1,1,false,false);
      sptk::StatisticsAccumulation::Buffer::Buffer(&local_b0);
      if (local_2e8.is_valid_ != false) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_2d0,(long)local_4b0,(allocator_type *)local_460);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_478,(long)local_4b0,(allocator_type *)local_460);
        iVar4 = 1;
        break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_460,"Failed to initialize StatisticsAccumulation",0x2b);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
      sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
      std::ios_base::~ios_base(local_3f0);
      iVar4 = 1;
      goto LAB_00104050;
    }
    if (iVar4 != 99) {
      if (iVar4 == 0x68) {
        anon_unknown.dwarf_2cfa::PrintUsage((ostream *)&std::cout);
        return 0;
      }
LAB_00103946:
      anon_unknown.dwarf_2cfa::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    local_480 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
  } while( true );
LAB_00103b52:
  bVar2 = sptk::ReadStream<double>(false,0,0,local_4b0,&local_2d0,(istream *)this,(int *)0x0);
  if (!bVar2) goto LAB_00103d87;
  bVar2 = sptk::StatisticsAccumulation::Run(&local_2e8,&local_2d0,&local_b0);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_460,"Failed to accumulate statistics",0x1f);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
    goto LAB_00103ffd;
  }
  if ((local_4ac != -1) && (iVar4 % local_4ac == 0)) {
    bVar2 = sptk::StatisticsAccumulation::GetSum(&local_2e8,&local_b0,&local_478);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_460,"Failed to accumulate statistics",0x1f);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
      sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
      goto LAB_00103ffd;
    }
    bVar2 = sptk::WriteStream<double>(0,local_4b0,&local_478,(ostream *)&std::cout,(int *)0x0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_460,"Failed to write statistics",0x1a);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
      sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
      goto LAB_00103ffd;
    }
    if ((local_480 & 1) == 0) {
      sptk::StatisticsAccumulation::Clear(&local_2e8,&local_b0);
    }
  }
  iVar4 = iVar4 + 1;
  goto LAB_00103b52;
LAB_00103d87:
  bVar2 = sptk::StatisticsAccumulation::GetNumData(&local_2e8,&local_b0,&local_484);
  if (bVar2) {
    iVar4 = 0;
    if ((local_4ac != -1) || (local_484 < 1)) goto LAB_0010402f;
    bVar2 = sptk::StatisticsAccumulation::GetSum(&local_2e8,&local_b0,&local_478);
    if (bVar2) {
      iVar4 = 0;
      bVar2 = sptk::WriteStream<double>(0,local_4b0,&local_478,(ostream *)&std::cout,(int *)0x0);
      if (bVar2) goto LAB_0010402f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_460,"Failed to write summation",0x19);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
      sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_460,"Failed to compute summation",0x1b);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
      sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_460,"Failed to accumulate statistics",0x1f);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_460);
  }
LAB_00103ffd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
  std::ios_base::~ios_base(local_3f0);
  iVar4 = 1;
LAB_0010402f:
  if (local_478.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_478.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00104050:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_b0);
LAB_0010405d:
  std::ifstream::~ifstream(&local_2b8);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  bool cumulative_mode_flag(kDefaultCumulativeModeFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:t:ch", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        cumulative_mode_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation accumulation(vector_length - 1, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::vector<double> data(vector_length);
  std::vector<double> sum(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!accumulation.GetSum(buffer, &sum)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!cumulative_mode_flag) {
        accumulation.Clear(&buffer);
      }
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!accumulation.GetSum(buffer, &sum)) {
      std::ostringstream error_message;
      error_message << "Failed to compute summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }

  return 0;
}